

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pragmaVtabBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  byte bVar1;
  sqlite3_index_constraint_usage *psVar2;
  long lVar3;
  uchar *puVar4;
  int iVar5;
  int iVar6;
  int seen [2];
  
  pIdxInfo->estimatedCost = 1.0;
  if (*(char *)&tab[1].zErrMsg != '\0') {
    seen[0] = 0;
    seen[1] = 0;
    iVar5 = 0;
    if (0 < pIdxInfo->nConstraint) {
      iVar5 = pIdxInfo->nConstraint;
    }
    puVar4 = &pIdxInfo->aConstraint->usable;
    for (iVar6 = 1; iVar6 - iVar5 != 1; iVar6 = iVar6 + 1) {
      bVar1 = *(byte *)((long)&tab[1].zErrMsg + 1);
      if (((int)(uint)bVar1 <= ((sqlite3_index_constraint *)(puVar4 + -5))->iColumn) &&
         (puVar4[-1] == '\x02')) {
        if (*puVar4 == '\0') {
          return 0x13;
        }
        seen[(long)((sqlite3_index_constraint *)(puVar4 + -5))->iColumn - (ulong)bVar1] = iVar6;
      }
      puVar4 = puVar4 + 0xc;
    }
    lVar3 = (long)seen[0];
    if (lVar3 != 0) {
      psVar2 = pIdxInfo->aConstraintUsage;
      psVar2[lVar3 + -1].argvIndex = 1;
      psVar2[lVar3 + -1].omit = '\x01';
      pIdxInfo->estimatedCost = 20.0;
      pIdxInfo->estimatedRows = 0x14;
      lVar3 = (long)seen[1];
      if (lVar3 == 0) {
        return 0;
      }
      psVar2[lVar3 + -1].argvIndex = 2;
      psVar2[lVar3 + -1].omit = '\x01';
      return 0;
    }
    pIdxInfo->estimatedCost = 2147483647.0;
    pIdxInfo->estimatedRows = 0x7fffffff;
  }
  return 0;
}

Assistant:

static int pragmaVtabBestIndex(sqlite3_vtab *tab, sqlite3_index_info *pIdxInfo){
  PragmaVtab *pTab = (PragmaVtab*)tab;
  const struct sqlite3_index_constraint *pConstraint;
  int i, j;
  int seen[2];

  pIdxInfo->estimatedCost = (double)1;
  if( pTab->nHidden==0 ){ return SQLITE_OK; }
  pConstraint = pIdxInfo->aConstraint;
  seen[0] = 0;
  seen[1] = 0;
  for(i=0; i<pIdxInfo->nConstraint; i++, pConstraint++){
    if( pConstraint->iColumn < pTab->iHidden ) continue;
    if( pConstraint->op!=SQLITE_INDEX_CONSTRAINT_EQ ) continue;
    if( pConstraint->usable==0 ) return SQLITE_CONSTRAINT;
    j = pConstraint->iColumn - pTab->iHidden;
    assert( j < 2 );
    seen[j] = i+1;
  }
  if( seen[0]==0 ){
    pIdxInfo->estimatedCost = (double)2147483647;
    pIdxInfo->estimatedRows = 2147483647;
    return SQLITE_OK;
  }
  j = seen[0]-1;
  pIdxInfo->aConstraintUsage[j].argvIndex = 1;
  pIdxInfo->aConstraintUsage[j].omit = 1;
  pIdxInfo->estimatedCost = (double)20;
  pIdxInfo->estimatedRows = 20;
  if( seen[1] ){
    j = seen[1]-1;
    pIdxInfo->aConstraintUsage[j].argvIndex = 2;
    pIdxInfo->aConstraintUsage[j].omit = 1;
  }
  return SQLITE_OK;
}